

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

int __thiscall HighsNodeQueue::unlink(HighsNodeQueue *this,char *__name)

{
  int extraout_EAX;
  char *local_30;
  CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> local_28;
  HighsNodeQueue *local_18;
  
  local_30 = __name;
  local_18 = this;
  if ((this->nodes).
      super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)__name].estimate < INFINITY) {
    local_28.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->hybridEstimRoot;
    local_28.first_ = &this->hybridEstimMin;
    ::highs::CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::unlink(&local_28,__name);
    local_28.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->lowerRoot;
    local_28.first_ = &this->lowerMin;
    local_18 = this;
    ::highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::unlink
              ((CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *)&local_28,local_30);
  }
  else {
    local_28.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->suboptimalRoot;
    local_28.first_ = &this->suboptimalMin;
    ::highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink
              ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)&local_28,__name);
    this->numSuboptimal = this->numSuboptimal + -1;
  }
  unlink_domchgs(this,(int64_t)local_30);
  std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::push
            (&this->freeslots,(value_type *)&local_30);
  return extraout_EAX;
}

Assistant:

void HighsNodeQueue::unlink(int64_t node) {
  if (nodes[node].estimate == kHighsInf) {
    unlink_suboptimal(node);
  } else {
    unlink_estim(node);
    unlink_lower(node);
  }
  unlink_domchgs(node);
  freeslots.push(node);
}